

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin.c
# Opt level: O2

int evaluate_choose(dmr_C *C,expression *expr)

{
  expression *peVar1;
  position pVar2;
  symbol *psVar3;
  undefined8 uVar4;
  unsigned_long_long uVar5;
  string *psVar6;
  expression *peVar7;
  undefined4 uVar8;
  int iVar9;
  void *pvVar10;
  longlong lVar11;
  int *piVar12;
  undefined1 local_60 [8];
  ptr_list_iter argiter__;
  expression *args [3];
  
  ptrlist_forward_iterator((ptr_list_iter *)local_60,(ptr_list *)(expr->field_5).field_2.string);
  piVar12 = &argiter__.__nr;
  while( true ) {
    pvVar10 = ptrlist_iter_next((ptr_list_iter *)local_60);
    if (pvVar10 == (void *)0x0) break;
    *(void **)piVar12 = pvVar10;
    piVar12 = piVar12 + 2;
  }
  lVar11 = dmrC_get_expression_value(C,(expression *)argiter__._16_8_);
  peVar1 = args[lVar11 == 0];
  uVar8 = *(undefined4 *)&peVar1->field_0x0;
  iVar9 = peVar1->op;
  pVar2 = peVar1->pos;
  psVar3 = peVar1->ctype;
  uVar4 = *(undefined8 *)&peVar1->field_0x18;
  uVar5 = (peVar1->field_5).field_0.value;
  psVar6 = (peVar1->field_5).field_2.string;
  peVar7 = (peVar1->field_5).field_14.ident_expression;
  (expr->field_5).field_10.cond_false = (peVar1->field_5).field_10.cond_false;
  (expr->field_5).field_14.ident_expression = peVar7;
  (expr->field_5).field_0.value = uVar5;
  (expr->field_5).field_2.string = psVar6;
  expr->ctype = psVar3;
  *(undefined8 *)&expr->field_0x18 = uVar4;
  *(undefined4 *)&expr->field_0x0 = uVar8;
  expr->op = iVar9;
  expr->pos = pVar2;
  return 1;
}

Assistant:

static int evaluate_choose(struct dmr_C *C, struct expression *expr)
{
	struct expression_list *list = expr->args;
	struct expression *arg, *args[3];
	int n = 0;

	/* there will be exactly 3; we'd already verified that */
	FOR_EACH_PTR(list, arg) {
		args[n++] = arg;
	} END_FOR_EACH_PTR(arg);

	*expr = dmrC_get_expression_value(C, args[0]) ? *args[1] : *args[2];

	return 1;
}